

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O0

uint64_t SipHashUint256(uint64_t k0,uint64_t k1,uint256 *val)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  _If_is_unsigned_integer<unsigned_long> _Var4;
  _If_is_unsigned_integer<unsigned_long> _Var5;
  ulong uVar6;
  _If_is_unsigned_integer<unsigned_long> _Var7;
  ulong uVar8;
  _If_is_unsigned_integer<unsigned_long> _Var9;
  _If_is_unsigned_integer<unsigned_long> _Var10;
  _If_is_unsigned_integer<unsigned_long> _Var11;
  ulong uVar12;
  ulong uVar13;
  base_blob<256U> *pbVar14;
  uint64_t uVar15;
  _If_is_unsigned_integer<unsigned_long> _Var16;
  _If_is_unsigned_integer<unsigned_long> _Var17;
  _If_is_unsigned_integer<unsigned_long> _Var18;
  ulong uVar19;
  ulong uVar20;
  _If_is_unsigned_integer<unsigned_long> _Var21;
  _If_is_unsigned_integer<unsigned_long> _Var22;
  _If_is_unsigned_integer<unsigned_long> _Var23;
  ulong uVar24;
  ulong uVar25;
  uint64_t uVar26;
  _If_is_unsigned_integer<unsigned_long> _Var27;
  _If_is_unsigned_integer<unsigned_long> _Var28;
  _If_is_unsigned_integer<unsigned_long> _Var29;
  ulong uVar30;
  ulong uVar31;
  _If_is_unsigned_integer<unsigned_long> _Var32;
  _If_is_unsigned_integer<unsigned_long> _Var33;
  _If_is_unsigned_integer<unsigned_long> _Var34;
  ulong uVar35;
  ulong uVar36;
  uint64_t uVar37;
  _If_is_unsigned_integer<unsigned_long> _Var38;
  _If_is_unsigned_integer<unsigned_long> _Var39;
  _If_is_unsigned_integer<unsigned_long> _Var40;
  ulong uVar41;
  ulong uVar42;
  _If_is_unsigned_integer<unsigned_long> _Var43;
  _If_is_unsigned_integer<unsigned_long> _Var44;
  _If_is_unsigned_integer<unsigned_long> _Var45;
  ulong uVar46;
  ulong uVar47;
  _If_is_unsigned_integer<unsigned_long> _Var48;
  _If_is_unsigned_integer<unsigned_long> _Var49;
  _If_is_unsigned_integer<unsigned_long> _Var50;
  ulong uVar51;
  ulong uVar52;
  _If_is_unsigned_integer<unsigned_long> _Var53;
  _If_is_unsigned_integer<unsigned_long> _Var54;
  _If_is_unsigned_integer<unsigned_long> _Var55;
  ulong uVar56;
  ulong uVar57;
  _If_is_unsigned_integer<unsigned_long> _Var58;
  _If_is_unsigned_integer<unsigned_long> _Var59;
  ulong uVar60;
  ulong uVar61;
  _If_is_unsigned_integer<unsigned_long> _Var62;
  _If_is_unsigned_integer<unsigned_long> _Var63;
  _If_is_unsigned_integer<unsigned_long> _Var64;
  ulong uVar65;
  ulong uVar66;
  _If_is_unsigned_integer<unsigned_long> _Var67;
  _If_is_unsigned_integer<unsigned_long> _Var68;
  _If_is_unsigned_integer<unsigned_long> _Var69;
  ulong uVar70;
  ulong uVar71;
  _If_is_unsigned_integer<unsigned_long> _Var72;
  _If_is_unsigned_integer<unsigned_long> _Var73;
  _If_is_unsigned_integer<unsigned_long> _Var74;
  ulong uVar75;
  ulong uVar76;
  ulong in_RSI;
  ulong in_RDI;
  long in_FS_OFFSET;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint64_t d;
  undefined8 in_stack_ffffffffffffffb0;
  int pos;
  base_blob<256U> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  uVar2 = base_blob<256U>::GetUint64(in_stack_ffffffffffffffb8,pos);
  uVar3 = in_RSI ^ 0x7465646279746573 ^ uVar2;
  _Var4 = std::rotl<unsigned_long>(uVar3,pos);
  _Var5 = std::rotl<unsigned_long>(uVar3,pos);
  uVar6 = uVar3 + (in_RDI ^ 0x6c7967656e657261);
  _Var7 = std::rotl<unsigned_long>(uVar3,pos);
  uVar3 = uVar6 ^ _Var7;
  uVar8 = uVar3 + _Var5;
  _Var5 = std::rotl<unsigned_long>(uVar3,pos);
  uVar3 = uVar8 ^ _Var5;
  _Var5 = std::rotl<unsigned_long>(uVar3,pos);
  _Var7 = std::rotl<unsigned_long>(uVar3,pos);
  _Var9 = std::rotl<unsigned_long>(uVar3,pos);
  _Var10 = std::rotl<unsigned_long>(uVar3,pos);
  _Var11 = std::rotl<unsigned_long>(uVar3,pos);
  uVar12 = uVar3 + _Var7 ^ _Var11;
  uVar13 = uVar12 + _Var10;
  _Var10 = std::rotl<unsigned_long>(uVar12,pos);
  pbVar14 = (base_blob<256U> *)(uVar13 ^ _Var10);
  _Var10 = std::rotl<unsigned_long>((unsigned_long)pbVar14,pos);
  _Var11 = std::rotl<unsigned_long>((unsigned_long)pbVar14,pos);
  uVar15 = base_blob<256U>::GetUint64(pbVar14,pos);
  uVar12 = uVar15 ^ (ulong)pbVar14;
  _Var16 = std::rotl<unsigned_long>(uVar12,pos);
  _Var17 = std::rotl<unsigned_long>(uVar12,pos);
  _Var18 = std::rotl<unsigned_long>(uVar12,pos);
  uVar19 = uVar12 + _Var11 ^ _Var18;
  uVar20 = uVar19 + _Var17;
  _Var17 = std::rotl<unsigned_long>(uVar19,pos);
  uVar19 = uVar20 ^ _Var17;
  _Var17 = std::rotl<unsigned_long>(uVar19,pos);
  _Var18 = std::rotl<unsigned_long>(uVar19,pos);
  _Var21 = std::rotl<unsigned_long>(uVar19,pos);
  _Var22 = std::rotl<unsigned_long>(uVar19,pos);
  _Var23 = std::rotl<unsigned_long>(uVar19,pos);
  uVar24 = uVar19 + _Var18 ^ _Var23;
  uVar25 = uVar24 + _Var22;
  _Var22 = std::rotl<unsigned_long>(uVar24,pos);
  pbVar14 = (base_blob<256U> *)(uVar25 ^ _Var22);
  _Var22 = std::rotl<unsigned_long>((unsigned_long)pbVar14,pos);
  _Var23 = std::rotl<unsigned_long>((unsigned_long)pbVar14,pos);
  uVar26 = base_blob<256U>::GetUint64(pbVar14,pos);
  uVar24 = uVar26 ^ (ulong)pbVar14;
  _Var27 = std::rotl<unsigned_long>(uVar24,pos);
  _Var28 = std::rotl<unsigned_long>(uVar24,pos);
  _Var29 = std::rotl<unsigned_long>(uVar24,pos);
  uVar30 = uVar24 + _Var23 ^ _Var29;
  uVar31 = uVar30 + _Var28;
  _Var28 = std::rotl<unsigned_long>(uVar30,pos);
  uVar30 = uVar31 ^ _Var28;
  _Var28 = std::rotl<unsigned_long>(uVar30,pos);
  _Var29 = std::rotl<unsigned_long>(uVar30,pos);
  _Var32 = std::rotl<unsigned_long>(uVar30,pos);
  _Var33 = std::rotl<unsigned_long>(uVar30,pos);
  _Var34 = std::rotl<unsigned_long>(uVar30,pos);
  uVar35 = uVar30 + _Var29 ^ _Var34;
  uVar36 = uVar35 + _Var33;
  _Var33 = std::rotl<unsigned_long>(uVar35,pos);
  pbVar14 = (base_blob<256U> *)(uVar36 ^ _Var33);
  _Var33 = std::rotl<unsigned_long>((unsigned_long)pbVar14,pos);
  _Var34 = std::rotl<unsigned_long>((unsigned_long)pbVar14,pos);
  uVar37 = base_blob<256U>::GetUint64(pbVar14,pos);
  uVar35 = uVar37 ^ (ulong)pbVar14;
  _Var38 = std::rotl<unsigned_long>(uVar35,pos);
  _Var39 = std::rotl<unsigned_long>(uVar35,pos);
  _Var40 = std::rotl<unsigned_long>(uVar35,pos);
  uVar41 = uVar35 + _Var34 ^ _Var40;
  uVar42 = uVar41 + _Var39;
  _Var39 = std::rotl<unsigned_long>(uVar41,pos);
  uVar41 = uVar42 ^ _Var39;
  _Var39 = std::rotl<unsigned_long>(uVar41,pos);
  _Var40 = std::rotl<unsigned_long>(uVar41,pos);
  _Var43 = std::rotl<unsigned_long>(uVar41,pos);
  _Var44 = std::rotl<unsigned_long>(uVar41,pos);
  _Var45 = std::rotl<unsigned_long>(uVar41,pos);
  uVar46 = uVar41 + _Var40 ^ _Var45;
  uVar47 = uVar46 + _Var44;
  _Var44 = std::rotl<unsigned_long>(uVar46,pos);
  uVar46 = uVar47 ^ _Var44;
  _Var44 = std::rotl<unsigned_long>(uVar46,pos);
  _Var45 = std::rotl<unsigned_long>(uVar46,pos);
  uVar46 = uVar46 ^ 0x2000000000000000;
  _Var48 = std::rotl<unsigned_long>(uVar46,pos);
  _Var49 = std::rotl<unsigned_long>(uVar46,pos);
  _Var50 = std::rotl<unsigned_long>(uVar46,pos);
  uVar51 = uVar46 + _Var45 ^ _Var50;
  uVar52 = uVar51 + _Var49;
  _Var49 = std::rotl<unsigned_long>(uVar51,pos);
  uVar51 = uVar52 ^ _Var49;
  _Var49 = std::rotl<unsigned_long>(uVar51,pos);
  _Var50 = std::rotl<unsigned_long>(uVar51,pos);
  _Var53 = std::rotl<unsigned_long>(uVar51,pos);
  _Var54 = std::rotl<unsigned_long>(uVar51,pos);
  _Var55 = std::rotl<unsigned_long>(uVar51,pos);
  uVar56 = uVar51 + _Var50 ^ _Var55;
  uVar57 = uVar56 + _Var54;
  _Var54 = std::rotl<unsigned_long>(uVar56,pos);
  uVar56 = uVar57 ^ _Var54;
  _Var54 = std::rotl<unsigned_long>(uVar56,pos);
  _Var55 = std::rotl<unsigned_long>(uVar56,pos);
  _Var58 = std::rotl<unsigned_long>(uVar56,pos);
  _Var59 = std::rotl<unsigned_long>(uVar56,pos);
  uVar60 = uVar56 + (_Var55 ^ 0xff);
  _Var55 = std::rotl<unsigned_long>(uVar56,pos);
  uVar56 = uVar60 ^ _Var55;
  uVar61 = uVar56 + _Var59;
  _Var55 = std::rotl<unsigned_long>(uVar56,pos);
  uVar56 = uVar61 ^ _Var55;
  _Var55 = std::rotl<unsigned_long>(uVar56,pos);
  _Var59 = std::rotl<unsigned_long>(uVar56,pos);
  _Var62 = std::rotl<unsigned_long>(uVar56,pos);
  _Var63 = std::rotl<unsigned_long>(uVar56,pos);
  _Var64 = std::rotl<unsigned_long>(uVar56,pos);
  uVar65 = uVar56 + _Var59 ^ _Var64;
  uVar66 = uVar65 + _Var63;
  _Var63 = std::rotl<unsigned_long>(uVar65,pos);
  uVar65 = uVar66 ^ _Var63;
  _Var63 = std::rotl<unsigned_long>(uVar65,pos);
  _Var64 = std::rotl<unsigned_long>(uVar65,pos);
  _Var67 = std::rotl<unsigned_long>(uVar65,pos);
  _Var68 = std::rotl<unsigned_long>(uVar65,pos);
  _Var69 = std::rotl<unsigned_long>(uVar65,pos);
  uVar70 = uVar65 + _Var64 ^ _Var69;
  uVar71 = uVar70 + _Var68;
  _Var68 = std::rotl<unsigned_long>(uVar70,pos);
  uVar70 = uVar71 ^ _Var68;
  _Var68 = std::rotl<unsigned_long>(uVar70,pos);
  _Var69 = std::rotl<unsigned_long>(uVar70,pos);
  _Var72 = std::rotl<unsigned_long>(uVar70,pos);
  _Var73 = std::rotl<unsigned_long>(uVar70,pos);
  _Var74 = std::rotl<unsigned_long>(uVar70,pos);
  uVar75 = uVar70 + _Var69 ^ _Var74;
  uVar76 = uVar75 + _Var73;
  _Var73 = std::rotl<unsigned_long>(uVar75,pos);
  uVar75 = uVar76 ^ _Var73;
  _Var73 = std::rotl<unsigned_long>(uVar75,pos);
  _Var74 = std::rotl<unsigned_long>(uVar75,pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar76 ^ ((((((((((((((((((((((((((((in_RSI ^ 0x646f72616e646f6d) +
                                               (in_RDI ^ 0x736f6d6570736575) ^ _Var4) + uVar6 ^
                                             _Var5) + uVar8 ^ _Var9) + uVar3 + _Var7 ^ _Var10) +
                                           (uVar2 ^ uVar13) ^ _Var16) + uVar12 + _Var11 ^ _Var17) +
                                         uVar20 ^ _Var21) + uVar19 + _Var18 ^ _Var22) +
                                       (uVar15 ^ uVar25) ^ _Var27) + uVar24 + _Var23 ^ _Var28) +
                                     uVar31 ^ _Var32) + uVar30 + _Var29 ^ _Var33) +
                                   (uVar26 ^ uVar36) ^ _Var38) + uVar35 + _Var34 ^ _Var39) + uVar42
                                ^ _Var43) + uVar41 + _Var40 ^ _Var44) + (uVar37 ^ uVar47) ^ _Var48)
                              + uVar46 + _Var45 ^ _Var49) + uVar52 ^ _Var53) + uVar51 + _Var50 ^
                           _Var54) + (uVar57 ^ 0x2000000000000000) ^ _Var58) + uVar60 ^ _Var55) +
                         uVar61 ^ _Var62) + uVar56 + _Var59 ^ _Var63) + uVar66 ^ _Var67) +
                      uVar65 + _Var64 ^ _Var68) + uVar71 ^ _Var72) + uVar70 + _Var69 ^ _Var73 ^
           _Var74 ^ uVar75;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t SipHashUint256(uint64_t k0, uint64_t k1, const uint256& val)
{
    /* Specialized implementation for efficiency */
    uint64_t d = val.GetUint64(0);

    uint64_t v0 = 0x736f6d6570736575ULL ^ k0;
    uint64_t v1 = 0x646f72616e646f6dULL ^ k1;
    uint64_t v2 = 0x6c7967656e657261ULL ^ k0;
    uint64_t v3 = 0x7465646279746573ULL ^ k1 ^ d;

    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(1);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(2);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    d = val.GetUint64(3);
    v3 ^= d;
    SIPROUND;
    SIPROUND;
    v0 ^= d;
    v3 ^= (uint64_t{4}) << 59;
    SIPROUND;
    SIPROUND;
    v0 ^= (uint64_t{4}) << 59;
    v2 ^= 0xFF;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    return v0 ^ v1 ^ v2 ^ v3;
}